

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::
PostWalker<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_wasm::Visitor<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_void>_>
::PostWalker(PostWalker<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_wasm::Visitor<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_void>_>
             *this)

{
  PostWalker<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_wasm::Visitor<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_void>_>
  *this_local;
  
  Walker<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_wasm::Visitor<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_void>_>
  ::Walker(&this->
            super_Walker<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_wasm::Visitor<wasm::Properties::(anonymous_namespace)::GenerativityScanner,_void>_>
          );
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }